

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hh
# Opt level: O2

bool __thiscall
hgdb::json::Scope<hgdb::json::VarStmt>::operator==
          (Scope<hgdb::json::VarStmt> *this,Scope<hgdb::json::VarStmt> *scope)

{
  bool bVar1;
  bool bVar2;
  __type_conflict2 _Var3;
  
  _Var3 = std::operator==(&this->filename,&scope->filename);
  if (_Var3) {
    bVar1 = (this->line_num).super__Optional_base<unsigned_int,_true,_true>._M_payload.
            super__Optional_payload_base<unsigned_int>._M_engaged;
    bVar2 = (scope->line_num).super__Optional_base<unsigned_int,_true,_true>._M_payload.
            super__Optional_payload_base<unsigned_int>._M_engaged;
    if (bVar1 == bVar2 && bVar1 == true) {
      if ((this->line_num).super__Optional_base<unsigned_int,_true,_true>._M_payload.
          super__Optional_payload_base<unsigned_int>._M_payload._M_value !=
          (scope->line_num).super__Optional_base<unsigned_int,_true,_true>._M_payload.
          super__Optional_payload_base<unsigned_int>._M_payload._M_value) {
        return false;
      }
    }
    else if (bVar1 != bVar2) {
      return false;
    }
    if (this->column_num == scope->column_num) {
      _Var3 = std::operator==(&this->condition,&scope->condition);
      return _Var3;
    }
  }
  return false;
}

Assistant:

[[nodiscard]] bool operator==(const Scope<T> &scope) const {
        // notice that we do not compare the inner scopes
        return filename == scope.filename && line_num == scope.line_num &&
               column_num == scope.column_num && condition == scope.condition;
    }